

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqclosure.h
# Opt level: O0

void __thiscall SQGenerator::SQGenerator(SQGenerator *this,SQSharedState *ss,SQClosure *closure)

{
  SQSharedState *in_RSI;
  SQCollectable_conflict *in_RDI;
  SQCollectable *in_stack_ffffffffffffffb0;
  SQClosure *x;
  SQWeakRef **this_00;
  
  SQCollectable::SQCollectable(in_stack_ffffffffffffffb0);
  (in_RDI->super_SQRefCounted)._vptr_SQRefCounted = (_func_int **)&PTR__SQGenerator_00162250;
  ::SQObjectPtr::SQObjectPtr((SQObjectPtr *)(in_RDI + 1));
  this_00 = &in_RDI[1].super_SQRefCounted._weakref;
  sqvector<SQObjectPtr>::sqvector((sqvector<SQObjectPtr> *)this_00);
  x = (SQClosure *)&in_RDI[1]._sharedstate;
  SQVM::CallInfo::CallInfo((CallInfo *)0x144fcd);
  sqvector<SQExceptionTrap>::sqvector
            ((sqvector<SQExceptionTrap> *)&in_RDI[3].super_SQRefCounted._weakref);
  ::SQObjectPtr::operator=((SQObjectPtr *)this_00,x);
  *(undefined4 *)&in_RDI[3]._sharedstate = 0;
  in_RDI[2]._next = (SQCollectable_conflict *)0x0;
  in_RDI->_next = (SQCollectable_conflict *)0x0;
  in_RDI->_prev = (SQCollectable_conflict *)0x0;
  in_RDI->_sharedstate = in_RSI;
  SQCollectable::AddToChain(&in_RDI->_sharedstate->_gc_chain,in_RDI);
  return;
}

Assistant:

SQGenerator(SQSharedState *ss,SQClosure *closure){_closure=closure;_state=eRunning;_ci._generator=NULL;INIT_CHAIN();ADD_TO_CHAIN(&_ss(this)->_gc_chain,this);}